

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  JavaNanoGenerator javanano_generator;
  Generator php_generator;
  ObjectiveCGenerator objc_generator;
  Generator csharp_generator;
  Generator rb_generator;
  JavaGenerator java_generator;
  Generator js_generator;
  CppGenerator cpp_generator;
  Generator py_generator;
  CommandLineInterface cli;
  allocator local_382;
  allocator local_381;
  string local_380;
  string local_360;
  allocator local_339;
  CodeGenerator local_338;
  CodeGenerator local_330;
  CodeGenerator local_328;
  CodeGenerator local_320;
  CodeGenerator local_318;
  CodeGenerator local_310;
  string local_308;
  CodeGenerator local_2e8;
  Generator local_2e0;
  CommandLineInterface local_2a0;
  
  google::protobuf::compiler::CommandLineInterface::CommandLineInterface(&local_2a0);
  std::__cxx11::string::string((string *)&local_2e0,"protoc-",(allocator *)&local_380);
  google::protobuf::compiler::CommandLineInterface::AllowPlugins(&local_2a0,(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  google::protobuf::compiler::cpp::CppGenerator::CppGenerator((CppGenerator *)&local_2e8);
  std::__cxx11::string::string((string *)&local_2e0,"--cpp_out",(allocator *)&local_308);
  std::__cxx11::string::string((string *)&local_380,"--cpp_opt",(allocator *)&local_310);
  std::__cxx11::string::string
            ((string *)&local_360,"Generate C++ header and source.",(allocator *)&local_338);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,(string *)&local_2e0,&local_380,&local_2e8,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_2e0);
  google::protobuf::compiler::java::JavaGenerator::JavaGenerator((JavaGenerator *)&local_310);
  std::__cxx11::string::string((string *)&local_2e0,"--java_out",(allocator *)&local_308);
  std::__cxx11::string::string((string *)&local_380,"--java_opt",(allocator *)&local_338);
  std::__cxx11::string::string
            ((string *)&local_360,"Generate Java source file.",(allocator *)&local_330);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,(string *)&local_2e0,&local_380,&local_310,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_2e0);
  google::protobuf::compiler::python::Generator::Generator(&local_2e0);
  std::__cxx11::string::string((string *)&local_380,"--python_out",(allocator *)&local_308);
  std::__cxx11::string::string
            ((string *)&local_360,"Generate Python source file.",(allocator *)&local_338);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,&local_380,&local_2e0.super_CodeGenerator,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  google::protobuf::compiler::javanano::JavaNanoGenerator::JavaNanoGenerator
            ((JavaNanoGenerator *)&local_338);
  std::__cxx11::string::string((string *)&local_380,"--javanano_out",(allocator *)&local_308);
  std::__cxx11::string::string
            ((string *)&local_360,"Generate Java Nano source file.",(allocator *)&local_330);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,&local_380,&local_338,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  local_330._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_00425cf0;
  std::__cxx11::string::string((string *)&local_380,"--php_out",(allocator *)&local_308);
  std::__cxx11::string::string
            ((string *)&local_360,"Generate PHP source file.",(allocator *)&local_318);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,&local_380,&local_330,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  local_318._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_00426278;
  std::__cxx11::string::string((string *)&local_380,"--ruby_out",(allocator *)&local_308);
  std::__cxx11::string::string
            ((string *)&local_360,"Generate Ruby source file.",(allocator *)&local_320);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,&local_380,&local_318,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  local_320._vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_00424e28;
  std::__cxx11::string::string((string *)&local_380,"--csharp_out",(allocator *)&local_328);
  std::__cxx11::string::string((string *)&local_360,"--csharp_opt",&local_381);
  std::__cxx11::string::string((string *)&local_308,"Generate C# source file.",&local_382);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,&local_380,&local_360,&local_320,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  google::protobuf::compiler::objectivec::ObjectiveCGenerator::ObjectiveCGenerator
            ((ObjectiveCGenerator *)&local_328);
  std::__cxx11::string::string((string *)&local_380,"--objc_out",&local_381);
  std::__cxx11::string::string((string *)&local_360,"--objc_opt",&local_382);
  std::__cxx11::string::string
            ((string *)&local_308,"Generate Objective C header and source.",&local_339);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,&local_380,&local_360,&local_328,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  local_308._M_dataplus._M_p = (pointer)&PTR__CodeGenerator_004256b0;
  std::__cxx11::string::string((string *)&local_380,"--js_out",&local_381);
  std::__cxx11::string::string((string *)&local_360,"Generate JavaScript source.",&local_382);
  google::protobuf::compiler::CommandLineInterface::RegisterGenerator
            (&local_2a0,&local_380,(CodeGenerator *)&local_308,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  iVar1 = google::protobuf::compiler::CommandLineInterface::Run(&local_2a0,argc,argv);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator((CodeGenerator *)&local_308);
  google::protobuf::compiler::objectivec::ObjectiveCGenerator::~ObjectiveCGenerator
            ((ObjectiveCGenerator *)&local_328);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator(&local_320);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator(&local_318);
  google::protobuf::compiler::CodeGenerator::~CodeGenerator(&local_330);
  google::protobuf::compiler::javanano::JavaNanoGenerator::~JavaNanoGenerator
            ((JavaNanoGenerator *)&local_338);
  google::protobuf::compiler::python::Generator::~Generator(&local_2e0);
  google::protobuf::compiler::java::JavaGenerator::~JavaGenerator((JavaGenerator *)&local_310);
  google::protobuf::compiler::cpp::CppGenerator::~CppGenerator((CppGenerator *)&local_2e8);
  google::protobuf::compiler::CommandLineInterface::~CommandLineInterface(&local_2a0);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {

  google::protobuf::compiler::CommandLineInterface cli;
  cli.AllowPlugins("protoc-");

  // Proto2 C++
  google::protobuf::compiler::cpp::CppGenerator cpp_generator;
  cli.RegisterGenerator("--cpp_out", "--cpp_opt", &cpp_generator,
                        "Generate C++ header and source.");

#ifndef OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP
  // Proto2 Java
  google::protobuf::compiler::java::JavaGenerator java_generator;
  cli.RegisterGenerator("--java_out", "--java_opt", &java_generator,
                        "Generate Java source file.");
#endif  // !OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP


#ifndef OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP
  // Proto2 Python
  google::protobuf::compiler::python::Generator py_generator;
  cli.RegisterGenerator("--python_out", &py_generator,
                        "Generate Python source file.");

  // Java Nano
  google::protobuf::compiler::javanano::JavaNanoGenerator javanano_generator;
  cli.RegisterGenerator("--javanano_out", &javanano_generator,
                        "Generate Java Nano source file.");

  // PHP
  google::protobuf::compiler::php::Generator php_generator;
  cli.RegisterGenerator("--php_out", &php_generator,
                        "Generate PHP source file.");

  // Ruby
  google::protobuf::compiler::ruby::Generator rb_generator;
  cli.RegisterGenerator("--ruby_out", &rb_generator,
                        "Generate Ruby source file.");

  // CSharp
  google::protobuf::compiler::csharp::Generator csharp_generator;
  cli.RegisterGenerator("--csharp_out", "--csharp_opt", &csharp_generator,
                        "Generate C# source file.");

  // Objective C
  google::protobuf::compiler::objectivec::ObjectiveCGenerator objc_generator;
  cli.RegisterGenerator("--objc_out", "--objc_opt", &objc_generator,
                        "Generate Objective C header and source.");

  // JavaScript
  google::protobuf::compiler::js::Generator js_generator;
  cli.RegisterGenerator("--js_out", &js_generator,
                        "Generate JavaScript source.");
#endif  // !OPENSOURCE_PROTOBUF_CPP_BOOTSTRAP

  return cli.Run(argc, argv);
}